

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O1

bool __thiscall
deqp::egl::Image::GLES2ImageApi::RenderReadPixelsRenderbuffer::invokeGLES2
          (RenderReadPixelsRenderbuffer *this,GLES2ImageApi *api,
          MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *img,
          Texture2D *reference)

{
  Functions *gl;
  glReadPixelsFunc p_Var1;
  bool bVar2;
  int i;
  uint uVar3;
  GLenum GVar4;
  long lVar5;
  ObjectTraits *pOVar6;
  undefined8 *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  RGBA threshold8;
  Surface screen;
  IVec4 threshold;
  Renderbuffer renderbuffer;
  Surface refSurface;
  Framebuffer framebuffer;
  IVec4 bitDepth;
  Vector<int,_4> res_1;
  RGBA local_25c;
  TextureFormat local_258;
  Surface local_250;
  uint local_238 [6];
  TextureFormat local_220;
  ObjectWrapper local_218;
  Surface local_1f8;
  ObjectWrapper local_1e0;
  tcu local_1c8 [16];
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  void *local_198;
  ios_base local_140 [272];
  
  gl = api->m_gl;
  tcu::getTextureFormatMantissaBitDepth(local_1c8,(TextureFormat *)reference);
  lVar5 = 0;
  do {
    *(undefined4 *)((long)&local_1e0.m_gl + lVar5 * 4) = 1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  lVar5 = 0;
  do {
    (&local_250.m_width)[lVar5] = 8;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_218.m_gl = (Functions *)0x0;
  local_218.m_traits = (ObjectTraits *)0x0;
  lVar5 = 0;
  do {
    *(int *)((long)&local_218.m_gl + lVar5 * 4) =
         (&local_250.m_width)[lVar5] - *(int *)(local_1c8 + lVar5 * 4);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_1b8._0_4_ = R;
  local_1b8._4_4_ = SNORM_INT8;
  pp_Stack_1b0 = (_func_int **)0x0;
  lVar5 = 0;
  do {
    *(int *)(local_1b8 + lVar5 * 4) =
         *(int *)((long)&local_1e0.m_gl + lVar5 * 4) <<
         (*(byte *)((long)&local_218.m_gl + lVar5 * 4) & 0x1f);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_238[0] = 0;
  local_238[1] = 0;
  local_238[2] = 0;
  local_238[3] = 0;
  lVar5 = 0;
  do {
    local_238[lVar5] = *(int *)(local_1b8 + lVar5 * 4) * 2;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  uVar8 = local_238[0];
  if (0xfe < (int)local_238[0]) {
    uVar8 = 0xff;
  }
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  uVar9 = local_238[1];
  if (0xfe < (int)local_238[1]) {
    uVar9 = 0xff;
  }
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  uVar10 = local_238[2];
  if (0xfe < (int)local_238[2]) {
    uVar10 = 0xff;
  }
  if ((int)uVar10 < 1) {
    uVar10 = 0;
  }
  uVar3 = 0xff;
  if ((int)local_238[3] < 0xff) {
    uVar3 = local_238[3];
  }
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  local_25c.m_value = uVar10 << 0x10 | uVar3 << 0x18 | uVar9 << 8 | uVar8;
  local_220 = (TextureFormat)(api->super_CallLogWrapper).m_log;
  pOVar6 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_1e0,gl,pOVar6);
  pOVar6 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_218,gl,pOVar6);
  tcu::Surface::Surface(&local_250,reference->m_width,reference->m_height);
  tcu::Surface::Surface(&local_1f8,reference->m_width,reference->m_height);
  if (2 < (reference->super_TextureLevelPyramid).m_format.order - D) {
    local_1b8._0_4_ = local_220.order;
    local_1b8._4_4_ = local_220.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1b0,"Reading with ReadPixels from renderbuffer",0x29);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
    std::ios_base::~ios_base(local_140);
    (*gl->bindFramebuffer)(0x8d40,local_1e0.m_object);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"bindFramebuffer(GL_FRAMEBUFFER, *framebuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2ca);
    (*gl->bindRenderbuffer)(0x8d41,local_218.m_object);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"bindRenderbuffer(GL_RENDERBUFFER, *renderbuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2cb);
    imageTargetRenderbuffer
              ((api->super_ImageApi).m_egl,gl,
               ((img->super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>).
                m_data.ptr)->m_image);
    framebufferRenderbuffer(gl,0x8ce0,local_218.m_object);
    (*gl->viewport)(0,0,reference->m_width,reference->m_height);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"viewport(0, 0, reference.getWidth(), reference.getHeight())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2cf);
    p_Var1 = gl->readPixels;
    local_258.order = RGBA;
    local_258.type = UNORM_INT8;
    if ((void *)local_250.m_pixels.m_cap != (void *)0x0) {
      local_250.m_pixels.m_cap = (size_t)local_250.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b8,&local_258,local_250.m_width,local_250.m_height,1,
               (void *)local_250.m_pixels.m_cap);
    (*p_Var1)(0,0,local_250.m_width,local_250.m_height,0x1908,0x1401,local_198);
    (*gl->bindFramebuffer)(0x8d40,0);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"bindFramebuffer(GL_FRAMEBUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2d3);
    (*gl->bindRenderbuffer)(0x8d41,0);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"bindRenderbuffer(GL_RENDERBUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2d4);
    (*gl->finish)();
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"finish()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x2d5);
    local_258.order = RGBA;
    local_258.type = UNORM_INT8;
    if ((void *)local_1f8.m_pixels.m_cap != (void *)0x0) {
      local_1f8.m_pixels.m_cap = (size_t)local_1f8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b8,&local_258,local_1f8.m_width,local_1f8.m_height,1,
               (void *)local_1f8.m_pixels.m_cap);
    tcu::copy((EVP_PKEY_CTX *)local_1b8,
              (EVP_PKEY_CTX *)
              (reference->super_TextureLevelPyramid).m_access.
              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
              _M_impl.super__Vector_impl_data._M_start);
    bVar2 = tcu::pixelThresholdCompare
                      ((TestLog *)local_220,"Renderbuffer read","Result from reading renderbuffer",
                       &local_1f8,&local_250,&local_25c,COMPARE_LOG_RESULT);
    tcu::Surface::~Surface(&local_1f8);
    tcu::Surface::~Surface(&local_250);
    glu::ObjectWrapper::~ObjectWrapper(&local_218);
    glu::ObjectWrapper::~ObjectWrapper(&local_1e0);
    return bVar2;
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = &PTR__exception_02167418;
  __cxa_throw(puVar7,&IllegalRendererException::typeinfo,std::exception::~exception);
}

Assistant:

bool GLES2ImageApi::RenderReadPixelsRenderbuffer::invokeGLES2 (GLES2ImageApi& api, MovePtr<UniqueImage>& img, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl				= api.m_gl;
	const tcu::IVec4		bitDepth		= tcu::getTextureFormatMantissaBitDepth(reference.getFormat());
	const tcu::IVec4		threshold		(2 * (tcu::IVec4(1) << (tcu::IVec4(8) - bitDepth)));
	const tcu::RGBA			threshold8		((deUint8)(de::clamp(threshold[0], 0, 255)), (deUint8)(de::clamp(threshold[1], 0, 255)), (deUint8)(de::clamp(threshold[2], 0, 255)), (deUint8)(de::clamp(threshold[3], 0, 255)));
	tcu::TestLog&			log				= api.getLog();
	Framebuffer				framebuffer		(gl);
	Renderbuffer			renderbuffer	(gl);
	tcu::Surface			screen			(reference.getWidth(), reference.getHeight());
	tcu::Surface			refSurface		(reference.getWidth(), reference.getHeight());

	// Branch only taken in TryAll case
	if (reference.getFormat().order == tcu::TextureFormat::DS || reference.getFormat().order == tcu::TextureFormat::D)
		throw IllegalRendererException(); // Skip, GLES2 does not support ReadPixels for depth attachments
	if (reference.getFormat().order == tcu::TextureFormat::S)
		throw IllegalRendererException(); // Skip, GLES2 does not support ReadPixels for stencil attachments

	log << tcu::TestLog::Message << "Reading with ReadPixels from renderbuffer" << tcu::TestLog::EndMessage;

	GLU_CHECK_GLW_CALL(gl, bindFramebuffer(GL_FRAMEBUFFER, *framebuffer));
	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, *renderbuffer));
	imageTargetRenderbuffer(api.m_egl, gl, **img);
	framebufferRenderbuffer(gl, GL_COLOR_ATTACHMENT0, *renderbuffer);

	GLU_CHECK_GLW_CALL(gl, viewport(0, 0, reference.getWidth(), reference.getHeight()));

	gl.readPixels(0, 0, screen.getWidth(), screen.getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen.getAccess().getDataPtr());

	GLU_CHECK_GLW_CALL(gl, bindFramebuffer(GL_FRAMEBUFFER, 0));
	GLU_CHECK_GLW_CALL(gl, bindRenderbuffer(GL_RENDERBUFFER, 0));
	GLU_CHECK_GLW_CALL(gl, finish());

	tcu::copy(refSurface.getAccess(), reference.getLevel(0));

	return tcu::pixelThresholdCompare(log, "Renderbuffer read", "Result from reading renderbuffer", refSurface, screen, threshold8, tcu::COMPARE_LOG_RESULT);

}